

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

PropertyBase *
Protocol::MQTT::V5::TypedProperty<(Protocol::MQTT::V5::PropertyType)17,_unsigned_int>::allocateProp
          (void)

{
  Property<unsigned_int> *this;
  
  this = (Property<unsigned_int> *)operator_new(0x38);
  Property<unsigned_int>::Property(this,SessionExpiryInterval,0,true);
  return (PropertyBase *)this;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }